

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

void __thiscall
Jinx::StaticArena<128UL,_16UL>::deallocate(StaticArena<128UL,_16UL> *this,char *p,size_t n)

{
  StaticArena<128UL,_16UL> *pSVar1;
  size_t local_10;
  char *local_8;
  
  pSVar1 = (StaticArena<128UL,_16UL> *)this->m_ptr;
  if ((pSVar1 < this) || (&this->m_ptr < pSVar1)) {
    __assert_fail("pointer_in_buffer(m_ptr) && \"short_alloc has outlived arena\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                  ,0xdb,
                  "void Jinx::StaticArena<128>::deallocate(char *, std::size_t) [N = 128, alignment = 16]"
                 );
  }
  if (&this->m_ptr < p || p < this) {
    if (p != (char *)0x0) {
      LOCK();
      Mem::freeCount.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           ((long)Mem::freeCount.super___atomic_base<unsigned_long>._M_i + 1);
      UNLOCK();
      if ((ulong)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i <
          (ulong)Mem::freeCount.super___atomic_base<unsigned_long>._M_i) {
        __assert_fail("Mem::allocationCount >= Mem::freeCount",
                      "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                      ,0x151b,"void Jinx::MemFree(void *, size_t)");
      }
      if ((ulong)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i < n) {
        __assert_fail("Mem::allocatedMemory >= bytes",
                      "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                      ,0x151c,"void Jinx::MemFree(void *, size_t)");
      }
      LOCK();
      Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i - n);
      UNLOCK();
      local_10 = n;
      local_8 = p;
      if (Mem::freeFn.super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*Mem::freeFn._M_invoker)((_Any_data *)&Mem::freeFn,&local_8,&local_10);
    }
  }
  else if ((StaticArena<128UL,_16UL> *)(p + (n + 0xf & 0xfffffffffffffff0)) == pSVar1) {
    this->m_ptr = p;
  }
  return;
}

Assistant:

void StaticArena<N, alignment>::deallocate(char * p, std::size_t n) noexcept
	{
		assert(pointer_in_buffer(m_ptr) && "short_alloc has outlived arena");
		if (pointer_in_buffer(p))
		{
			n = align_up(n);
			if (p + n == m_ptr)
				m_ptr = p;
		}
		else
			Jinx::MemFree(p, n);
	}